

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_waiter.cc
# Opt level: O1

int absl::lts_20250127::synchronization_internal::FutexWaiter::WaitUntil
              (atomic<int> *v,int32_t val,KernelTimeout t)

{
  int iVar1;
  timespec abs_timespec;
  KernelTimeout local_28;
  timespec local_20;
  
  local_28.rep_ = t.rep_;
  if (t.rep_ != 0xffffffffffffffff) {
    if ((t.rep_ & 1) == 0) {
      local_20 = KernelTimeout::MakeAbsTimespec(&local_28);
      iVar1 = FutexImpl::WaitAbsoluteTimeout(v,val,&local_20);
    }
    else {
      local_20 = KernelTimeout::MakeRelativeTimespec(&local_28);
      iVar1 = FutexImpl::WaitRelativeTimeout(v,val,&local_20);
    }
    return iVar1;
  }
  iVar1 = FutexImpl::WaitAbsoluteTimeout(v,val,(timespec *)0x0);
  return iVar1;
}

Assistant:

int FutexWaiter::WaitUntil(std::atomic<int32_t>* v, int32_t val,
                           KernelTimeout t) {
#ifdef CLOCK_MONOTONIC
  constexpr bool kHasClockMonotonic = true;
#else
  constexpr bool kHasClockMonotonic = false;
#endif

  // We can't call Futex::WaitUntil() here because the prodkernel implementation
  // does not know about KernelTimeout::SupportsSteadyClock().
  if (!t.has_timeout()) {
    return Futex::Wait(v, val);
  } else if (kHasClockMonotonic && KernelTimeout::SupportsSteadyClock() &&
             t.is_relative_timeout()) {
    auto rel_timespec = t.MakeRelativeTimespec();
    return Futex::WaitRelativeTimeout(v, val, &rel_timespec);
  } else {
    auto abs_timespec = t.MakeAbsTimespec();
    return Futex::WaitAbsoluteTimeout(v, val, &abs_timespec);
  }
}